

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O1

void bs_predict_vote(example *ec,vector<double,_std::allocator<double>_> *pred_vec)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  double dVar19;
  
  pdVar1 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar16 = (long)pdVar2 - (long)pdVar1 >> 3;
  iVar12 = 0;
  piVar8 = (int *)operator_new__(-(ulong)(uVar16 >> 0x3e != 0) | (long)pdVar2 - (long)pdVar1 >> 1);
  if ((long)pdVar2 - (long)pdVar1 == 0) {
    iVar13 = 1;
    bVar4 = 1;
    bVar18 = true;
  }
  else {
    iVar13 = 1;
    uVar15 = 0;
    bVar18 = false;
    iVar17 = 1;
    do {
      dVar19 = floor(pdVar1[uVar15] + 0.5);
      iVar6 = (int)dVar19;
      piVar8[uVar15] = iVar6;
      iVar5 = iVar17;
      iVar14 = iVar13;
      if ((!bVar18) && (iVar5 = iVar6, iVar14 = iVar6, (int)uVar15 != 0)) {
        bVar18 = iVar17 != iVar13 && (iVar13 != iVar6 && iVar17 != iVar6);
        iVar5 = iVar17;
        iVar14 = iVar13;
      }
      iVar17 = iVar5;
      if (iVar12 == 0) {
        iVar12 = 1;
        iVar13 = iVar6;
      }
      else {
        iVar13 = iVar14;
        if (iVar14 == iVar6) {
          iVar12 = iVar12 + 1;
        }
        else {
          iVar12 = iVar12 + -1;
        }
      }
      uVar15 = uVar15 + 1;
    } while ((uVar15 & 0xffffffff) < uVar16);
    bVar4 = bVar18 ^ 1;
    bVar18 = (bool)(iVar12 == 0 | bVar4);
  }
  if (bVar18) {
    bVar18 = false;
  }
  else {
    uVar15 = 0;
    if (pdVar2 != pdVar1) {
      uVar10 = 0;
      do {
        uVar7 = (int)uVar15 + (uint)(piVar8[uVar10] == iVar13);
        uVar15 = (ulong)uVar7;
        uVar10 = uVar10 + 1;
      } while ((uVar10 & 0xffffffff) < uVar16);
      uVar15 = (ulong)(uVar7 * 2);
    }
    bVar18 = uVar16 < uVar15;
  }
  if (!(bool)(bVar18 | bVar4)) {
    if (pdVar2 != pdVar1) {
      uVar15 = (long)pdVar2 - (long)pdVar1 >> 3;
      lVar3 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar8,piVar8 + uVar16,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar8,piVar8 + uVar16);
    }
    uVar16 = (long)(pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (1 < uVar16) {
      iVar12 = *piVar8;
      uVar9 = 1;
      uVar15 = 1;
      uVar11 = 2;
      uVar7 = 1;
      do {
        if (iVar12 == piVar8[uVar15]) {
          uVar9 = uVar9 + 1;
        }
        else {
          if (uVar7 < uVar9) {
            uVar7 = uVar9;
            iVar13 = iVar12;
          }
          uVar9 = 1;
          iVar12 = piVar8[uVar15];
        }
        uVar15 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar15 < uVar16);
    }
  }
  operator_delete__(piVar8);
  (ec->pred).scalar = (float)iVar13;
  ec->loss = (float)(~-(uint)((float)iVar13 == (ec->l).simple.label) & 0x3f800000) * ec->weight;
  return;
}

Assistant:

void bs_predict_vote(example& ec, vector<double>& pred_vec)
{
  // majority vote in linear time
  unsigned int counter = 0;
  int current_label = 1, init_label = 1;
  // float sum_labels = 0; // uncomment for: "avg on votes" and getLoss()
  bool majority_found = false;
  bool multivote_detected = false;  // distinct(votes)>2: used to skip part of the algorithm
  auto pred_vec_sz = pred_vec.size();
  int* pred_vec_int = new int[pred_vec_sz];

  for (unsigned int i = 0; i < pred_vec_sz; i++)
  {
    pred_vec_int[i] = (int)floor(
        pred_vec[i] + 0.5);  // could be added: link(), min_label/max_label, cutoff between true/false for binary

    if (multivote_detected == false)  // distinct(votes)>2 detection bloc
    {
      if (i == 0)
      {
        init_label = pred_vec_int[i];
        current_label = pred_vec_int[i];
      }
      else if (init_label != current_label && pred_vec_int[i] != current_label && pred_vec_int[i] != init_label)
        multivote_detected = true;  // more than 2 distinct votes detected
    }

    if (counter == 0)
    {
      counter = 1;
      current_label = pred_vec_int[i];
    }
    else
    {
      if (pred_vec_int[i] == current_label)
        counter++;
      else
      {
        counter--;
      }
    }
  }

  if (counter > 0 && multivote_detected)  // remove this condition for: "avg on votes" and getLoss()
  {
    counter = 0;
    for (unsigned int i = 0; i < pred_vec.size(); i++)
      if (pred_vec_int[i] == current_label)
      {
        counter++;
        // sum_labels += pred_vec[i]; // uncomment for: "avg on votes" and getLoss()
      }
    if (counter * 2 > pred_vec.size())
      majority_found = true;
  }

  if (multivote_detected && majority_found == false)  // then find most frequent element - if tie: smallest tie label
  {
    std::sort(pred_vec_int, pred_vec_int + pred_vec.size());
    int tmp_label = pred_vec_int[0];
    counter = 1;
    for (unsigned int i = 1, temp_count = 1; i < pred_vec.size(); i++)
    {
      if (tmp_label == pred_vec_int[i])
        temp_count++;
      else
      {
        if (temp_count > counter)
        {
          current_label = tmp_label;
          counter = temp_count;
        }
        tmp_label = pred_vec_int[i];
        temp_count = 1;
      }
    }
    /* uncomment for: "avg on votes" and getLoss()
    sum_labels = 0;
    for(unsigned int i=0; i<pred_vec.size(); i++)
      if(pred_vec_int[i] == current_label)
        sum_labels += pred_vec[i]; */
  }
  // TODO: unique_ptr would also handle exception case
  delete[] pred_vec_int;

  // ld.prediction = sum_labels/(float)counter; //replace line below for: "avg on votes" and getLoss()
  ec.pred.scalar = (float)current_label;

  // ec.loss = all.loss->getLoss(all.sd, ld.prediction, ld.label) * ec.weight; //replace line below for: "avg on votes"
  // and getLoss()
  ec.loss = ((ec.pred.scalar == ec.l.simple.label) ? 0.f : 1.f) * ec.weight;
}